

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

MixingHashState
absl::lts_20240722::hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>
::combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
          (MixingHashState state,void **value,
          basic_string_view<char,_std::char_traits<char>_> *values)

{
  size_t size;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  MixingHashState MVar4;
  uint64_t v_3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = state.state_ + (long)*value;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8)) + (long)*value;
  size = values->_M_len;
  MVar4 = MixingHashState::combine_contiguous
                    ((MixingHashState)
                     (SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0)),(uchar *)values->_M_str,size);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = MVar4.state_ + size;
  return (MixingHashState)
         (SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),8));
}

Assistant:

H HashStateBase<H>::combine(H state, const T& value, const Ts&... values) {
  return H::combine(hash_internal::HashSelect::template Apply<T>::Invoke(
                        std::move(state), value),
                    values...);
}